

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h
# Opt level: O0

TPZGeoElSide * __thiscall
TPZGeoElRefPattern<pzgeom::TPZGeoPoint>::SideSubElement
          (TPZGeoElRefPattern<pzgeom::TPZGeoPoint> *this,int side,int position)

{
  bool bVar1;
  int64_t index;
  long *plVar2;
  ostream *poVar3;
  void *this_00;
  TPZGeoEl *gel;
  int extraout_var;
  int in_ECX;
  int in_EDX;
  long *in_RSI;
  TPZGeoElSide *in_RDI;
  TPZGeoElSide subGeoEl;
  TPZGeoElSide tmp;
  int in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  TPZRefPattern *in_stack_ffffffffffffff30;
  int side_00;
  TPZGeoElSide *in_stack_ffffffffffffff40;
  TPZAutoPointer<TPZRefPattern> local_60;
  TPZGeoElSide local_58;
  undefined4 local_40;
  int local_18;
  int local_14;
  
  local_18 = in_ECX;
  local_14 = in_EDX;
  TPZGeoElSide::TPZGeoElSide((TPZGeoElSide *)in_stack_ffffffffffffff30);
  bVar1 = ::TPZAutoPointer::operator_cast_to_bool((TPZAutoPointer *)(in_RSI + 0x11));
  if (bVar1) {
    TPZGeoElSide::TPZGeoElSide((TPZGeoElSide *)in_stack_ffffffffffffff30);
    (**(code **)(*in_RSI + 0x2b0))(&local_60);
    TPZAutoPointer<TPZRefPattern>::operator->(&local_60);
    TPZRefPattern::SideSubGeoElSide
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28,
               (TPZGeoElSide *)0x15ccbf0);
    TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer
              ((TPZAutoPointer<TPZRefPattern> *)in_stack_ffffffffffffff30);
    index = TPZGeoElSide::Id((TPZGeoElSide *)0x15ccc17);
    plVar2 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RSI + 0xd),index);
    if (*plVar2 == -1) {
      poVar3 = std::operator<<((ostream *)&std::cerr,
                               "TPZGeoElRefPattern<TGeo>::SideSubElement : Error subelement not found for side "
                              );
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_14);
      poVar3 = std::operator<<(poVar3," position ");
      this_00 = (void *)std::ostream::operator<<(poVar3,local_18);
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      TPZGeoElSide::TPZGeoElSide((TPZGeoElSide *)in_stack_ffffffffffffff30);
    }
    else {
      gel = (TPZGeoEl *)TPZGeoElSide::Id((TPZGeoElSide *)0x15ccd1a);
      (**(code **)(*in_RSI + 0x1f8))(in_RSI,(ulong)gel & 0xffffffff);
      side_00 = extraout_var;
      TPZGeoElSide::Side(&local_58);
      TPZGeoElSide::TPZGeoElSide(in_stack_ffffffffffffff40,gel,side_00);
    }
    local_40 = 1;
    TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x15ccd80);
  }
  else {
    TPZGeoElSide::TPZGeoElSide
              ((TPZGeoElSide *)in_stack_ffffffffffffff30,
               (TPZGeoElSide *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    local_40 = 1;
  }
  TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x15ccd9e);
  return in_RDI;
}

Assistant:

TPZGeoElSide TPZGeoElRefPattern<TGeo>::SideSubElement(int side,int position){
	TPZGeoElSide tmp;
	if(!fRefPattern) return tmp;
	TPZGeoElSide subGeoEl;
	this->GetRefPattern()->SideSubGeoElSide(side,position,subGeoEl);
	if (fSubEl[subGeoEl.Id()] == -1) {
		PZError << "TPZGeoElRefPattern<TGeo>::SideSubElement : Error subelement not found for side "
		<< side << " position " << position << std::endl;
		return TPZGeoElSide();
	}
	return TPZGeoElSide (SubElement(subGeoEl.Id()),subGeoEl.Side());
}